

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void array_bitset_container_intersection
               (array_container_t *src_1,bitset_container_t *src_2,array_container_t *dst)

{
  uint16_t pos;
  int iVar1;
  _Bool _Var2;
  int local_2c;
  uint16_t key;
  int i;
  int32_t origcard;
  int32_t newcard;
  array_container_t *dst_local;
  bitset_container_t *src_2_local;
  array_container_t *src_1_local;
  
  if (dst->capacity < src_1->cardinality) {
    array_container_grow(dst,src_1->cardinality,false);
  }
  i = 0;
  iVar1 = src_1->cardinality;
  for (local_2c = 0; local_2c < iVar1; local_2c = local_2c + 1) {
    pos = src_1->array[local_2c];
    dst->array[i] = pos;
    _Var2 = bitset_container_contains(src_2,pos);
    i = (uint)_Var2 + i;
  }
  dst->cardinality = i;
  return;
}

Assistant:

void array_bitset_container_intersection(const array_container_t *src_1,
                                         const bitset_container_t *src_2,
                                         array_container_t *dst) {
    if (dst->capacity < src_1->cardinality) {
        array_container_grow(dst, src_1->cardinality, false);
    }
    int32_t newcard = 0;  // dst could be src_1
    const int32_t origcard = src_1->cardinality;
    for (int i = 0; i < origcard; ++i) {
        uint16_t key = src_1->array[i];
        // this branchless approach is much faster...
        dst->array[newcard] = key;
        newcard += bitset_container_contains(src_2, key);
        /**
         * we could do it this way instead...
         * if (bitset_container_contains(src_2, key)) {
         * dst->array[newcard++] = key;
         * }
         * but if the result is unpredictible, the processor generates
         * many mispredicted branches.
         * Difference can be huge (from 3 cycles when predictible all the way
         * to 16 cycles when unpredictible.
         * See
         * https://github.com/lemire/Code-used-on-Daniel-Lemire-s-blog/blob/master/extra/bitset/c/arraybitsetintersection.c
         */
    }
    dst->cardinality = newcard;
}